

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O1

UOConfig * __thiscall QPDFJob::UOConfig::from(UOConfig *this,string *parameter)

{
  vector<int,_std::allocator<int>_> local_30;
  
  if (parameter->_M_string_length != 0) {
    parseNumrange(&local_30,this->config->o,(parameter->_M_dataplus)._M_p,0);
    if (local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_30.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  std::__cxx11::string::_M_assign
            ((string *)
             &((this->config->o->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->under_overlay->from_nr);
  return this;
}

Assistant:

QPDFJob::UOConfig*
QPDFJob::UOConfig::from(std::string const& parameter)
{
    if (!parameter.empty()) {
        config->o.parseNumrange(parameter.c_str(), 0);
    }
    config->o.m->under_overlay->from_nr = parameter;
    return this;
}